

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::piece_picker::mark_as_canceled
          (piece_picker *this,piece_block block,torrent_peer *peer)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int priority;
  int iVar5;
  value_type *this_00;
  reference dp;
  block_info *pbVar6;
  pointer pdVar7;
  int new_priority;
  int prev_priority;
  block_info *info;
  span<libtorrent::aux::piece_picker::block_info> binfo;
  __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
  local_38;
  iterator i;
  piece_pos *p;
  torrent_peer *peer_local;
  piece_picker *this_local;
  piece_block block_local;
  
  this_local._0_4_ = (int)block.piece_index.m_val;
  i._M_current._4_4_ = this_local._0_4_;
  this_00 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
            ::operator[](&this->m_piece_map,this_local._0_4_);
  i._M_current._3_1_ = piece_pos::download_queue(this_00);
  bVar4 = strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void>::operator==
                    ((strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void> *)
                     ((long)&i._M_current + 3),&piece_pos::piece_open);
  if (!bVar4) {
    binfo.m_len._7_1_ = piece_pos::download_queue(this_00);
    binfo.m_len._0_4_ = this_local._0_4_;
    local_38._M_current =
         (downloading_piece *)find_dl_piece(this,binfo.m_len._7_1_,(piece_index_t)this_local._0_4_);
    dp = __gnu_cxx::
         __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
         ::operator*(&local_38);
    _info = mutable_blocks_for_piece(this,dp);
    this_local._4_4_ = block.block_index;
    pbVar6 = span<libtorrent::aux::piece_picker::block_info>::operator[]
                       ((span<libtorrent::aux::piece_picker::block_info> *)&info,
                        (long)this_local._4_4_);
    if ((*(ushort *)&pbVar6->field_0x8 >> 0xe != 3) &&
       (pbVar6->peer = peer, *(ushort *)&pbVar6->field_0x8 >> 0xe == 2)) {
      pdVar7 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
               ::operator->(&local_38);
      *(uint *)&pdVar7->field_0x6 =
           *(uint *)&pdVar7->field_0x6 & 0x8000ffff |
           ((ushort)(((ushort)((uint)*(undefined4 *)&pdVar7->field_0x6 >> 0x10) & 0x7fff) - 1) &
           0x7fff) << 0x10;
      *(ushort *)&pbVar6->field_0x8 = *(ushort *)&pbVar6->field_0x8 & 0x3fff;
      local_38._M_current = (downloading_piece *)update_piece_state(this,local_38._M_current);
      pdVar7 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
               ::operator->(&local_38);
      uVar2 = *(uint *)&pdVar7->field_0x6;
      pdVar7 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
               ::operator->(&local_38);
      uVar3 = *(uint *)&pdVar7->field_0x6;
      pdVar7 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
               ::operator->(&local_38);
      uVar1 = *(ushort *)&pdVar7->field_0xa;
      pdVar7 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
               ::operator->(&local_38);
      if ((uVar2 & 0x7fff) + (uVar3 >> 0x10 & 0x7fff) + (uint)(uVar1 & 0x7fff) +
          (uint)(*(ushort *)&pdVar7->field_0xa >> 0xf) == 0) {
        priority = piece_pos::priority(this_00,this);
        erase_download_piece(this,(iterator)local_38._M_current);
        iVar5 = piece_pos::priority(this_00,this);
        if (((this->m_dirty & 1U) == 0) && (iVar5 != priority)) {
          if (priority == -1) {
            add(this,(piece_index_t)this_local._0_4_);
          }
          else {
            update(this,priority,(prio_index_t)(this_00->index).m_val);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void piece_picker::mark_as_canceled(piece_block const block, aux::torrent_peer* peer)
	{
#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "mark_as_cancelled( {"
			<< block.piece_index << ", " << block.block_index
			<< "} )" << std::endl;
#endif

#if TORRENT_USE_INVARIANT_CHECKS
		check_piece_state();
#endif
		TORRENT_ASSERT(block.block_index >= 0);
		piece_pos& p = m_piece_map[block.piece_index];

		if (p.download_queue() == piece_pos::piece_open) return;

		auto i = find_dl_piece(p.download_queue(), block.piece_index);

		TORRENT_ASSERT(i != m_downloads[p.download_queue()].end());
		auto const binfo = mutable_blocks_for_piece(*i);
		block_info& info = binfo[block.block_index];

		if (info.state == block_info::state_finished) return;

		TORRENT_ASSERT(info.num_peers == 0);
		info.peer = peer;
		TORRENT_ASSERT(info.state == block_info::state_writing
			|| peer == nullptr);
		if (info.state == block_info::state_writing)
		{
			--i->writing;
			info.state = block_info::state_none;
			// i may be invalid after this call
			i = update_piece_state(i);

			if (i->finished + i->writing + i->requested + i->hashing == 0)
			{
				int const prev_priority = p.priority(this);
				erase_download_piece(i);
				int const new_priority = p.priority(this);

				if (m_dirty) return;
				if (new_priority == prev_priority) return;
				if (prev_priority == -1) add(block.piece_index);
				else update(prev_priority, p.index);
			}
		}
		else
		{
			TORRENT_ASSERT(info.state == block_info::state_none);
		}

#if TORRENT_USE_INVARIANT_CHECKS
		check_piece_state();
#endif
	}